

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Xform *xform,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  reference_conflict __x;
  size_type sVar2;
  mapped_type *this;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ostringstream local_220 [8];
  ostringstream ss_w;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  Xform *xform_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,properties,&xform->super_GPrim,warn,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (bool)(options->strict_allowedToken_check & 1));
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while( true ) {
      bVar1 = ::std::operator!=(&__end2,(_Self *)&prop);
      if (!bVar1) break;
      __x = ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
            ::operator*(&__end2);
      sVar2 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)__x);
      if (sVar2 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(xform->super_GPrim).props,(key_type *)__x);
        Property::operator=(this,&__x->second);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&__x->first);
      }
      sVar2 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)__x);
      if (sVar2 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_220);
        poVar3 = ::std::operator<<((ostream *)local_220,"[warn]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReconstructPrim");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xae2);
        ::std::operator<<(poVar3," ");
        ::std::operator+(&local_240,"Unsupported/unimplemented property: ",&__x->first);
        poVar3 = ::std::operator<<((ostream *)local_220,(string *)&local_240);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)&local_240);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_260,local_280);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_260);
          ::std::__cxx11::string::~string((string *)local_260);
          ::std::__cxx11::string::~string((string *)local_280);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_220);
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = true;
  }
  else {
    spec_local._7_1_ = false;
  }
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return spec_local._7_1_;
}

Assistant:

bool ReconstructPrim<Xform>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Xform *xform,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)options;
  (void)references;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, xform, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    ADD_PROPERTY(table, prop, Xform, xform->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}